

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_test.cc
# Opt level: O3

void __thiscall
(anonymous_namespace)::BlendA64MaskTest8B_DISABLED_Speed_Test::
~BlendA64MaskTest8B_DISABLED_Speed_Test(BlendA64MaskTest8B_DISABLED_Speed_Test *this)

{
  libaom_test::CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
  ::~CodecTestWith3Params
            ((CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
              *)(this + -0x10));
  operator_delete((CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
                   *)(this + -0x10));
  return;
}

Assistant:

TEST_P(BlendA64MaskTest8B, DISABLED_Speed) {
  const int kRunTimes = 10000000;
  for (int bsize = 0; bsize < BLOCK_SIZES_ALL; ++bsize) {
    for (int i = 0; i < kBufSize; ++i) {
      dst_ref_[i] = rng_.Rand8();
      dst_tst_[i] = rng_.Rand8();

      src0_[i] = rng_.Rand8();
      src1_[i] = rng_.Rand8();
    }

    for (int i = 0; i < kMaxMaskSize; ++i)
      mask_[i] = rng_(AOM_BLEND_A64_MAX_ALPHA + 1);

    RunTest(bsize, kRunTimes);
  }
}